

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_cleanup(Curl_multi *multi)

{
  Curl_easy *pCVar1;
  undefined1 local_d0 [8];
  sigpipe_ignore pipe_st;
  _Bool restore_pipe;
  Curl_easy *nextdata;
  Curl_easy *data;
  Curl_multi *multi_local;
  
  if ((multi == (Curl_multi *)0x0) || (multi->type != 0xbab1e)) {
    multi_local._4_4_ = CURLM_BAD_HANDLE;
  }
  else {
    pipe_st._159_1_ = 0;
    multi->type = 0;
    close_all_connections(multi);
    if (multi->closure_handle != (Curl_easy *)0x0) {
      sigpipe_ignore(multi->closure_handle,(sigpipe_ignore *)local_d0);
      pipe_st._159_1_ = 1;
      (multi->closure_handle->dns).hostcache = &multi->hostcache;
      Curl_hostcache_clean(multi->closure_handle,(multi->closure_handle->dns).hostcache);
      Curl_close(multi->closure_handle);
    }
    Curl_hash_destroy(&multi->sockhash);
    Curl_conncache_destroy(&multi->conn_cache);
    Curl_llist_destroy(&multi->msglist,(void *)0x0);
    Curl_llist_destroy(&multi->pending,(void *)0x0);
    nextdata = multi->easyp;
    while (nextdata != (Curl_easy *)0x0) {
      pCVar1 = nextdata->next;
      if ((nextdata->dns).hostcachetype == HCACHE_MULTI) {
        Curl_hostcache_clean(nextdata,(nextdata->dns).hostcache);
        (nextdata->dns).hostcache = (curl_hash *)0x0;
        (nextdata->dns).hostcachetype = HCACHE_NONE;
      }
      (nextdata->state).conn_cache = (conncache *)0x0;
      nextdata->multi = (Curl_multi *)0x0;
      nextdata = pCVar1;
    }
    Curl_hash_destroy(&multi->hostcache);
    Curl_pipeline_set_site_blacklist((char **)0x0,&multi->pipelining_site_bl);
    Curl_pipeline_set_server_blacklist((char **)0x0,&multi->pipelining_server_bl);
    (*Curl_cfree)(multi);
    if ((pipe_st._159_1_ & 1) != 0) {
      sigpipe_restore((sigpipe_ignore *)local_d0);
    }
    multi_local._4_4_ = CURLM_OK;
  }
  return multi_local._4_4_;
}

Assistant:

CURLMcode curl_multi_cleanup(struct Curl_multi *multi)
{
  struct Curl_easy *data;
  struct Curl_easy *nextdata;

  if(GOOD_MULTI_HANDLE(multi)) {
    bool restore_pipe = FALSE;
    SIGPIPE_VARIABLE(pipe_st);

    multi->type = 0; /* not good anymore */

    /* Close all the connections in the connection cache */
    close_all_connections(multi);

    if(multi->closure_handle) {
      sigpipe_ignore(multi->closure_handle, &pipe_st);
      restore_pipe = TRUE;

      multi->closure_handle->dns.hostcache = &multi->hostcache;
      Curl_hostcache_clean(multi->closure_handle,
                           multi->closure_handle->dns.hostcache);

      Curl_close(multi->closure_handle);
    }

    Curl_hash_destroy(&multi->sockhash);
    Curl_conncache_destroy(&multi->conn_cache);
    Curl_llist_destroy(&multi->msglist, NULL);
    Curl_llist_destroy(&multi->pending, NULL);

    /* remove all easy handles */
    data = multi->easyp;
    while(data) {
      nextdata=data->next;
      if(data->dns.hostcachetype == HCACHE_MULTI) {
        /* clear out the usage of the shared DNS cache */
        Curl_hostcache_clean(data, data->dns.hostcache);
        data->dns.hostcache = NULL;
        data->dns.hostcachetype = HCACHE_NONE;
      }

      /* Clear the pointer to the connection cache */
      data->state.conn_cache = NULL;
      data->multi = NULL; /* clear the association */

      data = nextdata;
    }

    Curl_hash_destroy(&multi->hostcache);

    /* Free the blacklists by setting them to NULL */
    Curl_pipeline_set_site_blacklist(NULL, &multi->pipelining_site_bl);
    Curl_pipeline_set_server_blacklist(NULL, &multi->pipelining_server_bl);

    free(multi);
    if(restore_pipe)
      sigpipe_restore(&pipe_st);

    return CURLM_OK;
  }
  return CURLM_BAD_HANDLE;
}